

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_rkv_reg.c
# Opt level: O2

MPP_RET rkv_h264d_deinit(void *hal)

{
  long lVar1;
  void *ptr;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)hal + 0x90);
  lVar2 = 0x78;
  if (*(int *)((long)hal + 0x98) == 0) {
    lVar2 = 0x28;
  }
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 0x28) {
    ptr = *(void **)(lVar1 + 0x2b0 + lVar3);
    if (ptr != (void *)0x0) {
      mpp_osal_free("rkv_h264d_deinit",ptr);
    }
    *(undefined8 *)(lVar1 + 0x2b0 + lVar3) = 0;
    mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x298 + lVar3),"rkv_h264d_deinit");
    mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x2a0 + lVar3),"rkv_h264d_deinit");
    mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x2a8 + lVar3),"rkv_h264d_deinit");
  }
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x280),"rkv_h264d_deinit");
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x288),"rkv_h264d_deinit");
  if (*(void **)((long)hal + 0x90) != (void *)0x0) {
    mpp_osal_free("rkv_h264d_deinit",*(void **)((long)hal + 0x90));
  }
  *(undefined8 *)((long)hal + 0x90) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET rkv_h264d_deinit(void *hal)
{
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;
    H264dRkvRegCtx_t *reg_ctx = (H264dRkvRegCtx_t *)p_hal->reg_ctx;

    RK_U32 i = 0;
    RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    for (i = 0; i < loop; i++) {
        MPP_FREE(reg_ctx->reg_buf[i].regs);
        mpp_buffer_put(reg_ctx->reg_buf[i].spspps);
        mpp_buffer_put(reg_ctx->reg_buf[i].rps);
        mpp_buffer_put(reg_ctx->reg_buf[i].sclst);
    }
    mpp_buffer_put(reg_ctx->cabac_buf);
    mpp_buffer_put(reg_ctx->errinfo_buf);
    MPP_FREE(p_hal->reg_ctx);

    return MPP_OK;
}